

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fake_network.cxx
# Opt level: O0

bool __thiscall
nuraft::FakeNetwork::delieverReqTo(FakeNetwork *this,string *endpoint,bool random_order)

{
  bool bVar1;
  int iVar2;
  element_type *this_00;
  SimpleLogger *pSVar3;
  undefined8 uVar4;
  element_type *peVar5;
  element_type *peVar6;
  byte in_DL;
  undefined8 in_RSI;
  bool in_stack_0000002f;
  string *in_stack_00000030;
  FakeNetwork *in_stack_00000038;
  ptr<resp_msg> resp;
  SimpleLogger *ll;
  ReqPkg *pkg;
  iterator pkg_entry;
  ptr<FakeClient> conn;
  FakeClient *in_stack_fffffffffffffe78;
  RespPkg *in_stack_fffffffffffffe80;
  const_iterator in_stack_fffffffffffffe88;
  rpc_handler *in_stack_fffffffffffffe90;
  ptr<resp_msg> *in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  FakeNetwork *in_stack_fffffffffffffec8;
  SimpleLogger *this_01;
  msg_type in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  _List_const_iterator<nuraft::FakeNetwork::ReqPkg> local_e8 [7];
  string local_b0 [48];
  string local_80 [32];
  SimpleLogger *local_60;
  reference local_58;
  _Self local_50;
  _Self local_48;
  undefined4 local_40;
  byte local_19;
  msg_type type;
  bool local_1;
  
  type = (msg_type)((ulong)in_RSI >> 0x20);
  local_19 = in_DL & 1;
  findClient(in_stack_fffffffffffffec8,
             (string *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  std::__shared_ptr_access<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x13fe3c);
  bVar1 = FakeClient::isDstOnline(in_stack_fffffffffffffe78);
  if (bVar1) {
    std::__shared_ptr_access<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x13fec3);
    local_48._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<nuraft::FakeNetwork::ReqPkg,_std::allocator<nuraft::FakeNetwork::ReqPkg>_>::begin
                   ((list<nuraft::FakeNetwork::ReqPkg,_std::allocator<nuraft::FakeNetwork::ReqPkg>_>
                     *)in_stack_fffffffffffffe78);
    std::__shared_ptr_access<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x13fee4);
    local_50._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<nuraft::FakeNetwork::ReqPkg,_std::allocator<nuraft::FakeNetwork::ReqPkg>_>::end
                   ((list<nuraft::FakeNetwork::ReqPkg,_std::allocator<nuraft::FakeNetwork::ReqPkg>_>
                     *)in_stack_fffffffffffffe78);
    bVar1 = std::operator==(&local_48,&local_50);
    if (bVar1) {
      local_1 = false;
      local_40 = 1;
    }
    else {
      local_58 = std::_List_iterator<nuraft::FakeNetwork::ReqPkg>::operator*
                           ((_List_iterator<nuraft::FakeNetwork::ReqPkg> *)0x13ff38);
      this_00 = std::
                __shared_ptr_access<nuraft::FakeNetworkBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nuraft::FakeNetworkBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x13ff51);
      pSVar3 = FakeNetworkBase::getLogger(this_00);
      local_60 = pSVar3;
      if (pSVar3 != (SimpleLogger *)0x0) {
        in_stack_fffffffffffffee4 =
             SimpleLogger::getLogLevel((SimpleLogger *)in_stack_fffffffffffffe88._M_node);
        if (3 < in_stack_fffffffffffffee4) {
          this_01 = local_60;
          uVar4 = std::__cxx11::string::c_str();
          in_stack_fffffffffffffe80 = (RespPkg *)std::__cxx11::string::c_str();
          peVar5 = std::
                   __shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x13ffde);
          in_stack_fffffffffffffee0 = msg_base::get_type(&peVar5->super_msg_base);
          msg_type_to_string_abi_cxx11_(type);
          in_stack_fffffffffffffe88._M_node = (_List_node_base *)std::__cxx11::string::c_str();
          SimpleLogger::put(this_01,4,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/fake_network.cxx"
                            ,"delieverReqTo",0xa7,"[BEGIN] send/process %s -> %s, %s",uVar4);
          std::__cxx11::string::~string(local_80);
        }
      }
      std::__shared_ptr_access<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x140097);
      gotMsg((FakeNetwork *)pSVar3,
             (ptr<req_msg> *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
      if (local_60 != (SimpleLogger *)0x0) {
        iVar2 = SimpleLogger::getLogLevel((SimpleLogger *)in_stack_fffffffffffffe88._M_node);
        pSVar3 = local_60;
        if (3 < iVar2) {
          uVar4 = std::__cxx11::string::c_str();
          in_stack_fffffffffffffe80 = (RespPkg *)std::__cxx11::string::c_str();
          peVar5 = std::
                   __shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x140123);
          msg_base::get_type(&peVar5->super_msg_base);
          msg_type_to_string_abi_cxx11_(type);
          in_stack_fffffffffffffe88._M_node = (_List_node_base *)std::__cxx11::string::c_str();
          SimpleLogger::put(pSVar3,4,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/fake_network.cxx"
                            ,"delieverReqTo",0xac,"[END] send/process %s -> %s, %s",uVar4);
          std::__cxx11::string::~string(local_b0);
        }
      }
      peVar6 = std::
               __shared_ptr_access<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1401f5);
      RespPkg::RespPkg((RespPkg *)&peVar6->pendingResps,in_stack_fffffffffffffe98,
                       in_stack_fffffffffffffe90);
      std::__cxx11::
      list<nuraft::FakeNetwork::RespPkg,_std::allocator<nuraft::FakeNetwork::RespPkg>_>::push_back
                ((list<nuraft::FakeNetwork::RespPkg,_std::allocator<nuraft::FakeNetwork::RespPkg>_>
                  *)in_stack_fffffffffffffe90,(value_type *)in_stack_fffffffffffffe88._M_node);
      RespPkg::~RespPkg(in_stack_fffffffffffffe80);
      std::__shared_ptr_access<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x14024f);
      std::_List_const_iterator<nuraft::FakeNetwork::ReqPkg>::_List_const_iterator
                (local_e8,&local_48);
      std::__cxx11::list<nuraft::FakeNetwork::ReqPkg,_std::allocator<nuraft::FakeNetwork::ReqPkg>_>
      ::erase((list<nuraft::FakeNetwork::ReqPkg,_std::allocator<nuraft::FakeNetwork::ReqPkg>_> *)
              in_stack_fffffffffffffe80,in_stack_fffffffffffffe88);
      local_1 = true;
      local_40 = 1;
      std::shared_ptr<nuraft::resp_msg>::~shared_ptr((shared_ptr<nuraft::resp_msg> *)0x1402a7);
    }
  }
  else {
    local_1 = makeReqFail(in_stack_00000038,in_stack_00000030,in_stack_0000002f);
    local_40 = 1;
  }
  std::shared_ptr<nuraft::FakeClient>::~shared_ptr((shared_ptr<nuraft::FakeClient> *)0x1402e6);
  return local_1;
}

Assistant:

bool FakeNetwork::delieverReqTo(const std::string& endpoint,
                                bool random_order)
{
    // this:                    source (sending request)
    // conn->dstNet (endpoint): destination (sending response)
    ptr<FakeClient> conn = findClient(endpoint);

    // If destination is offline, make failure.
    if (!conn->isDstOnline()) return makeReqFail(endpoint, random_order);

    auto pkg_entry = conn->pendingReqs.begin();
    if (pkg_entry == conn->pendingReqs.end()) return false;

    ReqPkg& pkg = *pkg_entry;

    SimpleLogger* ll = base->getLogger();
    _log_info(ll, "[BEGIN] send/process %s -> %s, %s",
              myEndpoint.c_str(), endpoint.c_str(),
              msg_type_to_string( pkg.req->get_type() ).c_str() );

    ptr<resp_msg> resp = conn->dstNet->gotMsg( pkg.req );
    _log_info(ll, "[END] send/process %s -> %s, %s",
              myEndpoint.c_str(), endpoint.c_str(),
              msg_type_to_string( pkg.req->get_type() ).c_str() );

    conn->pendingResps.push_back( FakeNetwork::RespPkg(resp, pkg.whenDone) );
    conn->pendingReqs.erase(pkg_entry);
    return true;
}